

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<double> fmt::v10::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  compute_mul_parity_result cVar12;
  cache_entry_type *cache_00;
  significand_type extraout_RAX;
  byte bVar13;
  uint uVar14;
  uint extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar15;
  char cVar16;
  int iVar17;
  int in_ESI;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint128_fallback uVar25;
  decimal_fp<double> dVar26;
  decimal_fp<double> dVar27;
  decimal_fp<double> dVar28;
  decimal_fp<double> dVar29;
  cache_entry_type cache;
  uint32_t dist;
  uint128_fallback local_48;
  uint local_34;
  
  uVar23 = (ulong)x & 0xfffffffffffff;
  uVar24 = (uint)((ulong)x >> 0x34) & 0x7ff;
  if (uVar24 != 0) {
    uVar24 = uVar24 - 0x433;
    if (uVar23 != 0) {
      uVar23 = uVar23 + 0x10000000000000;
      goto LAB_0014cb39;
    }
    iVar15 = (int)(uVar24 * 0x9a209 + -0x3fe1f) >> 0x15;
    cVar16 = (char)(iVar15 * -0x1a934f >> 0x13) + (char)uVar24;
    uVar25 = cache_accessor<double>::get_cached_power
                       ((cache_accessor<double> *)(ulong)(uint)-iVar15,in_ESI);
    uVar19 = uVar25.hi_;
    bVar13 = 0xb - cVar16;
    uVar20 = (uVar19 >> 0x35) + uVar19 >> (bVar13 & 0x3f);
    uVar22 = (ulong)((uVar24 & 0xfffffffe) != 2) + (uVar19 - (uVar19 >> 0x36) >> (bVar13 & 0x3f));
    uVar23 = uVar20 / 10;
    if (uVar23 * 10 < uVar22) {
      uVar19 = (uVar19 >> (10U - cVar16 & 0x3f)) + 1 >> 1;
      if (uVar24 == 0xffffffb3) {
        uVar19 = uVar19 & 0xfffffffffffffffe;
      }
      else {
        uVar19 = uVar19 + (uVar19 < uVar22);
      }
      goto LAB_0014ceb7;
    }
    if (9 < uVar20) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar23;
      if (SUB168(auVar5 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
          (auVar5 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
          (undefined1  [16])0x0) {
        uVar23 = uVar23 / 100000000;
        if ((int)uVar23 == 0) goto LAB_0014ceda;
        iVar17 = 6;
        do {
          uVar24 = (uint)uVar23;
          uVar14 = uVar24 * 0x40000000 | uVar24 * -0x3d70a3d7 >> 2;
          uVar23 = (ulong)uVar14;
          iVar17 = iVar17 + 2;
        } while (uVar14 < 0x28f5c29);
LAB_0014ce41:
        uVar14 = uVar24 * -0x33333333 >> 1 | (uint)((uVar24 * -0x33333333 & 1) != 0) << 0x1f;
        bVar11 = uVar14 < 0x1999999a;
        if (!bVar11) {
          uVar14 = uVar24;
        }
        uVar19 = (ulong)uVar14;
      }
      else {
        iVar17 = -2;
        do {
          uVar20 = uVar23;
          uVar23 = uVar20 * -0x70a3d70a3d70a3d7 >> 2 | uVar20 << 0x3e;
          iVar17 = iVar17 + 2;
        } while (uVar23 < 0x28f5c28f5c28f5d);
        uVar19 = uVar20 * -0x3333333333333333 >> 1 | uVar20 << 0x3f;
        bVar11 = uVar19 < 0x199999999999999a;
        if (!bVar11) {
          uVar19 = uVar20;
        }
      }
LAB_0014ceb0:
      iVar15 = iVar15 + 1 + iVar17 + (uint)bVar11;
      goto LAB_0014ceb7;
    }
LAB_0014ced5:
    to_decimal<double>();
LAB_0014ceda:
    pcVar21 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format-inl.h"
    ;
    puVar18 = (ulong *)0x472;
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format-inl.h"
                ,0x472,"");
    if ((int)extraout_EDX < 1) {
      cache_accessor<double>::compute_mul_parity();
    }
    else if (extraout_EDX < 0x40) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pcVar21;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *puVar18;
      uVar23 = SUB168(auVar6 * auVar9,8) + puVar18[1] * (long)pcVar21;
      bVar13 = (byte)extraout_EDX & 0x3f;
      dVar27._8_8_ = uVar23 << bVar13 | SUB168(auVar6 * auVar9,0) >> 0x40 - bVar13;
      dVar27.significand =
           (ulong)CONCAT11(dVar27._8_8_ == 0,
                           (uVar23 >> ((ulong)(byte)(0x40 - (byte)extraout_EDX) & 0x3f) & 1) != 0);
      return dVar27;
    }
    cache_accessor<double>::compute_mul_parity();
    if (1000 < *(uint *)pcVar21) {
      check_divisibility_and_divide_by_pow10<2>();
      *(ulong **)pcVar21 = puVar18;
      dVar29._8_8_ = extraout_RDX_00;
      dVar29.significand = extraout_RAX;
      return dVar29;
    }
    uVar14 = *(uint *)pcVar21 * 0x290;
    uVar24 = uVar14 & 0xffff;
    dVar28.significand = (ulong)CONCAT31((int3)(uVar24 >> 8),uVar24 < 0x290);
    *(uint *)pcVar21 = uVar14 >> 0x10;
    dVar28._8_8_ = extraout_RDX;
    return dVar28;
  }
  uVar24 = 0xfffffbce;
  if (uVar23 == 0) {
    iVar15 = 0;
    uVar19 = 0;
    goto LAB_0014ceb7;
  }
LAB_0014cb39:
  iVar15 = (int)(uVar24 * 0x4d105) >> 0x14;
  local_48 = cache_accessor<double>::get_cached_power
                       ((cache_accessor<double> *)(ulong)(2U - iVar15),in_ESI);
  cache_00 = (cache_entry_type *)local_48.lo_;
  iVar17 = ((int)((2U - iVar15) * 0x1a934f) >> 0x13) + uVar24;
  uVar19 = uVar23 * 2 + 1 << ((byte)iVar17 & 0x3f);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar19;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_48.hi_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar19;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = cache_00;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SUB168(auVar2 * auVar8,8);
  auVar10 = auVar1 * auVar7 + auVar10;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = auVar10._8_8_;
  uVar19 = SUB168(auVar3 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
  uVar24 = auVar10._8_4_ + (int)uVar19 * -1000;
  uVar14 = (uint)(local_48.hi_ >> (~(byte)iVar17 & 0x3f));
  if (uVar24 < uVar14) {
    if (((uVar24 != 0) || (auVar10._0_8_ != 0)) || ((uVar23 & 1) == 0)) {
LAB_0014cc23:
      if (uVar19 == 0) {
        to_decimal<double>();
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar19;
        if (0xabcc77118461cefc < SUB168(auVar4 * ZEXT816(0xabcc77118461cefd),0) ||
            (auVar4 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) !=
            (undefined1  [16])0x0) {
          iVar17 = -2;
          do {
            uVar23 = uVar19;
            uVar19 = uVar23 * -0x70a3d70a3d70a3d7 >> 2 | uVar23 << 0x3e;
            iVar17 = iVar17 + 2;
          } while (uVar19 < 0x28f5c28f5c28f5d);
          uVar19 = uVar23 * -0x3333333333333333 >> 1 | uVar23 << 0x3f;
          bVar11 = uVar19 < 0x199999999999999a;
          if (!bVar11) {
            uVar19 = uVar23;
          }
          goto LAB_0014ceb0;
        }
        uVar19 = uVar19 / 100000000;
        if (uVar19 != 0) {
          iVar17 = 6;
          do {
            uVar24 = (uint)uVar19;
            uVar14 = uVar24 * 0x40000000 | uVar24 * -0x3d70a3d7 >> 2;
            uVar19 = (ulong)uVar14;
            iVar17 = iVar17 + 2;
          } while (uVar14 < 0x28f5c29);
          goto LAB_0014ce41;
        }
      }
      to_decimal<double>();
      goto LAB_0014ced5;
    }
    uVar19 = uVar19 - 1;
    uVar24 = 1000;
  }
  else if (uVar24 <= uVar14) {
    cache_00 = &local_48;
    cVar12 = cache_accessor<double>::compute_mul_parity(uVar23 * 2 - 1,cache_00,iVar17);
    if ((~(uint)uVar23 & (uint)((ushort)cVar12 >> 8) & 1) != 0 || ((ushort)cVar12 & 1) != 0)
    goto LAB_0014cc23;
  }
  uVar24 = uVar24 - (uVar14 >> 1);
  local_34 = uVar24 + 0x32;
  bVar11 = check_divisibility_and_divide_by_pow10<2>((dragonbox *)&local_34,(uint32_t *)cache_00);
  uVar14 = local_34;
  uVar19 = (ulong)local_34 + uVar19 * 10;
  if (bVar11) {
    cVar12 = cache_accessor<double>::compute_mul_parity(uVar23 * 2,&local_48,iVar17);
    if ((uVar24 & 1) == ((ushort)cVar12 & 1)) {
      uVar19 = uVar19 + (long)(int)-((ushort)cVar12 >> 8 & uVar14 & 1);
    }
    else {
      uVar19 = uVar19 - 1;
    }
  }
LAB_0014ceb7:
  dVar26.exponent = iVar15;
  dVar26.significand = uVar19;
  dVar26._12_4_ = 0;
  return dVar26;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}